

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/application.cpp:86:31)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_application_cpp:86:31)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  FileName *in_RDX;
  long *in_RSI;
  long in_RDI;
  Ref<embree::ParseStream> local_40;
  FileName *local_38;
  Ref<embree::ParseStream> *local_18;
  Ref<embree::ParseStream> *local_10;
  
  local_18 = &local_40;
  local_40.ptr = (ParseStream *)*in_RSI;
  local_38 = in_RDX;
  if (local_40.ptr != (ParseStream *)0x0) {
    (*((local_40.ptr)->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])();
  }
  anon_class_8_1_8991fb9c_for_f::operator()
            ((anon_class_8_1_8991fb9c_for_f *)(in_RDI + 0x30),&local_40,local_38);
  local_10 = &local_40;
  if (local_40.ptr != (ParseStream *)0x0) {
    (*((local_40.ptr)->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])();
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }